

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O1

size_t linenoiseUtf8NextCharLen(char *buf,size_t buf_len,size_t pos,size_t *col_len)

{
  ulong *puVar1;
  long *plVar2;
  undefined8 in_RAX;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  long lVar6;
  bool bVar7;
  int cp;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  sVar3 = utf8BytesToCodePoint(buf + pos,buf_len - pos,(int *)((long)&uStack_38 + 4));
  uVar4 = (ulong)uStack_38._4_4_;
  lVar6 = 0;
  do {
    puVar1 = (ulong *)((long)combiningCharTable + lVar6);
    if (*puVar1 == uVar4) break;
    bVar7 = lVar6 != 0x3ce8;
    lVar6 = lVar6 + 8;
  } while (bVar7);
  if (*puVar1 == uVar4) {
    sVar3 = 0;
  }
  else {
    if (col_len != (size_t *)0x0) {
      lVar6 = 8;
      do {
        if ((*(ulong *)((long)combiningCharTable + lVar6 + 0x3ce8) <= uVar4) &&
           (uVar4 <= *(ulong *)((long)wideCharTable[0] + lVar6))) {
          sVar5 = 2;
          goto LAB_0010ce1b;
        }
        lVar6 = lVar6 + 0x10;
      } while (lVar6 != 0x798);
      sVar5 = 1;
LAB_0010ce1b:
      *col_len = sVar5;
    }
    uVar4 = sVar3 + pos;
    if (uVar4 < buf_len) {
      do {
        sVar3 = utf8BytesToCodePoint(buf + uVar4,buf_len - uVar4,(int *)((long)&uStack_38 + 4));
        lVar6 = 0;
        do {
          plVar2 = (long *)((long)combiningCharTable + lVar6);
          if (*plVar2 == (long)uStack_38._4_4_) break;
          bVar7 = lVar6 != 0x3ce8;
          lVar6 = lVar6 + 8;
        } while (bVar7);
      } while ((*plVar2 == (long)uStack_38._4_4_) && (uVar4 = uVar4 + sVar3, uVar4 < buf_len));
    }
    sVar3 = uVar4 - pos;
  }
  return sVar3;
}

Assistant:

size_t linenoiseUtf8NextCharLen(const char* buf, size_t buf_len, size_t pos, size_t *col_len) {
    size_t beg = pos;
    int cp;
    size_t len = utf8BytesToCodePoint(buf + pos, buf_len - pos, &cp);
    if (isCombiningChar(cp)) {
        /* NOTREACHED */
        return 0;
    }
    if (col_len != NULL) *col_len = isWideChar(cp) ? 2 : 1;
    pos += len;
    while (pos < buf_len) {
        len = utf8BytesToCodePoint(buf + pos, buf_len - pos, &cp);
        if (!isCombiningChar(cp)) return pos - beg;
        pos += len;
    }
    return pos - beg;
}